

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlChar * xmlSchemaGetComponentTypeStr(xmlSchemaBasicItemPtr item)

{
  char *pcVar1;
  xmlChar *pxVar2;
  
  if (item->type == XML_SCHEMA_TYPE_BASIC) {
    pcVar1 = "simple type definition";
    if (item[10].type == 0x2d) {
      pcVar1 = "complex type definition";
    }
    return (xmlChar *)pcVar1;
  }
  pxVar2 = xmlSchemaItemTypeToStr(item->type);
  return pxVar2;
}

Assistant:

static const xmlChar *
xmlSchemaGetComponentTypeStr(xmlSchemaBasicItemPtr item)
{
    switch (item->type) {
	case XML_SCHEMA_TYPE_BASIC:
	    if (WXS_IS_COMPLEX(WXS_TYPE_CAST item))
		return(BAD_CAST "complex type definition");
	    else
		return(BAD_CAST "simple type definition");
	default:
	    return(xmlSchemaItemTypeToStr(item->type));
    }
}